

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosLog.h
# Opt level: O3

void adios2::helper::ThrowNested<std::runtime_error>
               (string *component,string *source,string *activity,string *message,int commRank)

{
  string m;
  runtime_error local_38 [16];
  string local_28;
  
  MakeMessage(&local_28,component,source,activity,message,commRank,EXCEPTION);
  std::runtime_error::runtime_error(local_38,(string *)&local_28);
  std::throw_with_nested<std::runtime_error>(local_38);
}

Assistant:

void ThrowNested(const std::string &component, const std::string &source,
                 const std::string &activity, const std::string &message, const int commRank = -1)
{
    auto m = MakeMessage(component, source, activity, message, commRank, LogMode::EXCEPTION);
    throw_with_nested(T(m));
}